

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfImage.cpp
# Opt level: O1

Box2i * __thiscall Imf_3_4::Image::dataWindowForLevel(Image *this,int lx,int ly)

{
  long lVar1;
  ulong uVar2;
  ostream *poVar3;
  ArgExc *this_00;
  ulong uVar4;
  stringstream _iex_throw_s;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  uVar2 = (ulong)(uint)lx;
  if ((((-1 < lx) && (-1 < ly)) && (lVar1 = (this->_levels)._sizeY, (long)uVar2 < lVar1)) &&
     ((uVar4 = (ulong)(uint)ly, (long)uVar4 < (this->_levels)._sizeX &&
      ((this->_levels)._data[lVar1 * uVar4 + uVar2] != (ImageLevel *)0x0)))) {
    return &(this->_levels)._data[uVar4 * (this->_levels)._sizeY + uVar2]->_dataWindow;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_190,"Cannot get data window for invalid image level (",0x30);
  poVar3 = (ostream *)std::ostream::operator<<(local_190,lx);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,ly);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,").",2);
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(this_00,local_1a0);
  __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

const Box2i&
Image::dataWindowForLevel (int lx, int ly) const
{
    if (!levelNumberIsValid (lx, ly))
    {
        THROW (
            ArgExc,
            "Cannot get data window for invalid image "
            "level ("
                << lx << ", " << ly << ").");
    }

    return _levels[ly][lx]->dataWindow ();
}